

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftutil.c
# Opt level: O0

void FT_List_Insert(FT_List list,FT_ListNode node)

{
  FT_ListNode pFVar1;
  FT_ListNode after;
  FT_ListNode node_local;
  FT_List list_local;
  
  if ((list != (FT_List)0x0) && (node != (FT_ListNode)0x0)) {
    pFVar1 = list->head;
    node->next = pFVar1;
    node->prev = (FT_ListNode)0x0;
    if (pFVar1 == (FT_ListNode)0x0) {
      list->tail = node;
    }
    else {
      pFVar1->prev = node;
    }
    list->head = node;
  }
  return;
}

Assistant:

FT_EXPORT_DEF( void )
  FT_List_Insert( FT_List      list,
                  FT_ListNode  node )
  {
    FT_ListNode  after;


    if ( !list || !node )
      return;

    after = list->head;

    node->next = after;
    node->prev = NULL;

    if ( !after )
      list->tail = node;
    else
      after->prev = node;

    list->head = node;
  }